

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O1

bool __thiscall sjtu::timeType::operator<(timeType *this,timeType *other)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = 0;
  iVar2 = 0;
  if (0 < this->month) {
    iVar2 = 0;
    lVar3 = 1;
    do {
      iVar2 = iVar2 + *(int *)(months + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while ((ulong)(uint)this->month + 1 != lVar3);
  }
  if (0 < other->month) {
    iVar1 = 0;
    lVar3 = 1;
    do {
      iVar1 = iVar1 + *(int *)(months + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while ((ulong)(uint)other->month + 1 != lVar3);
  }
  return (this->hour + (this->day + iVar2) * 0x18) * 0x3c + this->minute <
         ((iVar1 + other->day) * 0x18 + other->hour) * 0x3c + other->minute;
}

Assistant:

bool timeType::operator<(const timeType &other) const {
            int tmp1 = 0, tmp2 = 0;
            for (int i = 1; i <= month; ++i)
                tmp1 += months[i];
            tmp1 += day;
            tmp1 *= 24;
            tmp1 += hour;
            tmp1 *= 60;
            tmp1 += minute;
            for (int i = 1; i <= other.month; ++i)
                tmp2 += other.months[i];
            tmp2 += other.day;
            tmp2 *= 24;
            tmp2 += other.hour;
            tmp2 *= 60;
            tmp2 += other.minute;
            return (tmp1 < tmp2);
        }